

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec * cram_subexp_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *__ptr;
  cram_encoding cVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  cram_encoding cVar6;
  long lStack_20;
  
  __ptr = (cram_codec *)malloc(0x240);
  if (__ptr == (cram_codec *)0x0) {
    return (cram_codec *)0x0;
  }
  __ptr->codec = E_SUBEXP;
  __ptr->decode = cram_subexp_decode;
  __ptr->free = cram_subexp_decode_free;
  bVar1 = *data;
  cVar2 = (cram_encoding)bVar1;
  lVar5 = 1;
  if (-1 < (char)bVar1) goto LAB_0013762b;
  cVar6 = (cram_encoding)(byte)data[1];
  uVar4 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    lStack_20 = 2;
    cVar2 = (uVar4 & 0x3f) << 8;
  }
  else {
    if (bVar1 < 0xe0) {
      cVar2 = (uVar4 & 0x1f) << 0x10 | cVar6 << 8 | (uint)(byte)data[2];
      lVar5 = 3;
      goto LAB_0013762b;
    }
    if (bVar1 < 0xf0) {
      cVar2 = (uVar4 & 0xf) << 0x18 | cVar6 << 0x10 | (uint)(byte)data[2] << 8 | (uint)(byte)data[3]
      ;
      lVar5 = 4;
      goto LAB_0013762b;
    }
    lStack_20 = 5;
    cVar6 = (uint)(byte)data[3] << 4 | (uint)(byte)data[2] << 0xc | cVar6 << 0x14 | uVar4 << 0x1c;
    cVar2 = (byte)data[4] & (E_GOLOMB_RICE|E_SUBEXP);
  }
  cVar2 = cVar2 | cVar6;
  lVar5 = lStack_20;
LAB_0013762b:
  (__ptr->field_6).e_byte_array_len.len_encoding = cVar2;
  bVar1 = data[lVar5];
  uVar4 = (uint)bVar1;
  lStack_20 = 1;
  if ((char)bVar1 < '\0') {
    uVar3 = (uint)bVar1;
    uVar4 = (uint)(byte)data[lVar5 + 1];
    if (bVar1 < 0xc0) {
      uVar4 = (uVar3 & 0x3f) << 8 | uVar4;
      lStack_20 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar4 = (uVar3 & 0x1f) << 0x10 | uVar4 << 8 | (uint)(byte)data[lVar5 + 2];
      lStack_20 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar4 = (uVar3 & 0xf) << 0x18 | uVar4 << 0x10 | (uint)(byte)data[lVar5 + 2] << 8 |
              (uint)(byte)data[lVar5 + 3];
      lStack_20 = 4;
    }
    else {
      uVar4 = (byte)data[lVar5 + 4] & 0xf |
              (uint)(byte)data[lVar5 + 3] << 4 |
              (uint)(byte)data[lVar5 + 2] << 0xc | uVar4 << 0x14 | uVar3 << 0x1c;
      lStack_20 = 5;
    }
  }
  *(uint *)((long)&__ptr->field_6 + 4) = uVar4;
  if (lStack_20 + lVar5 != (long)size) {
    fwrite("Malformed subexp header stream\n",0x1f,1,_stderr);
    free(__ptr);
    return (cram_codec *)0x0;
  }
  return __ptr;
}

Assistant:

cram_codec *cram_subexp_decode_init(char *data, int size,
				    enum cram_external_type option,
				    int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_SUBEXP;
    c->decode = cram_subexp_decode;
    c->free   = cram_subexp_decode_free;
    
    cp += itf8_get(cp, &c->subexp.offset);
    cp += itf8_get(cp, &c->subexp.k);

    if (cp - data != size) {
	fprintf(stderr, "Malformed subexp header stream\n");
	free(c);
	return NULL;
    }

    return c;
}